

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::unsafe_arena_set_allocated_options
          (FieldDescriptorProto *this,FieldOptions *options)

{
  Arena *pAVar1;
  long in_RSI;
  long in_RDI;
  FieldDescriptorProto *in_stack_ffffffffffffffc0;
  
  pAVar1 = GetArenaNoVirtual(in_stack_ffffffffffffffc0);
  if ((pAVar1 == (Arena *)0x0) && (*(long **)(in_RDI + 0x40) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x40) + 8))();
  }
  *(long *)(in_RDI + 0x40) = in_RSI;
  if (in_RSI == 0) {
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) & 0xffffffdf;
  }
  else {
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 0x20;
  }
  return;
}

Assistant:

void FieldDescriptorProto::unsafe_arena_set_allocated_options(
    PROTOBUF_NAMESPACE_ID::FieldOptions* options) {
  if (GetArenaNoVirtual() == nullptr) {
    delete options_;
  }
  options_ = options;
  if (options) {
    _has_bits_[0] |= 0x00000020u;
  } else {
    _has_bits_[0] &= ~0x00000020u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:google.protobuf.FieldDescriptorProto.options)
}